

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result(Expression_lhs<bool_&> *this)

{
  uint uVar1;
  ContextOptions *pCVar2;
  undefined8 *in_RSI;
  Result *in_RDI;
  bool res;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  byte local_11;
  
  local_11 = *(byte *)*in_RSI & 1;
  if ((*(uint *)(in_RSI + 1) & 0x100) != 0) {
    local_11 = (local_11 ^ 0xff) & 1;
  }
  if ((local_11 != 0) && (pCVar2 = getContextOptions(), (pCVar2->success & 1U) == 0)) {
    uVar1 = (uint)local_11;
    String::String((String *)0x1f15e6);
    Result::Result((Result *)CONCAT44(uVar1,in_stack_ffffffffffffff70),
                   (bool)in_stack_ffffffffffffff6f,(String *)0x1f15fc);
    String::~String((String *)CONCAT44(uVar1,in_stack_ffffffffffffff70));
    return in_RDI;
  }
  doctest::toString((bool)in_stack_ffffffffffffff6f);
  Result::Result((Result *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (bool)in_stack_ffffffffffffff6f,(String *)0x1f15a3);
  String::~String((String *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return in_RDI;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only for MSVC 2015
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) { //!OCLINT bitwise operator in conditional
                res = !res;
            }

            if(!res || getContextOptions()->success) {
                return { res, (DOCTEST_STRINGIFY(lhs)) };
            }
            return { res };
        }